

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

Int64 Imf_2_5::anon_unknown_7::writeLineOffsets
                (OStream *os,vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets)

{
  pointer puVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  allocator<char> local_41;
  string local_40 [32];
  
  iVar2 = (*os->_vptr_OStream[3])();
  if (CONCAT44(extraout_var,iVar2) == 0xffffffffffffffff) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"Cannot determine current file position (%T).",&local_41);
    Iex_2_5::throwErrnoExc(local_40);
    std::__cxx11::string::~string(local_40);
  }
  uVar3 = 0;
  while( true ) {
    puVar1 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(lineOffsets->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= (ulong)uVar3) break;
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,puVar1[uVar3]);
    uVar3 = uVar3 + 1;
  }
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

Int64
writeLineOffsets (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, const vector<Int64> &lineOffsets)
{
    Int64 pos = os.tellp();

    if (pos == static_cast<Int64>(-1))
	IEX_NAMESPACE::throwErrnoExc ("Cannot determine current file position (%T).");
    
    for (unsigned int i = 0; i < lineOffsets.size(); i++)
	Xdr::write<StreamIO> (os, lineOffsets[i]);

    return pos;
}